

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O3

int32_t parse_init_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  char *pcVar1;
  FILE *pFVar2;
  Btor2Line *pBVar3;
  int32_t iVar4;
  int64_t absid;
  void *__s;
  Btor2Parser *__ptr;
  uint uVar5;
  int64_t absid_1;
  Btor2Line *pBVar6;
  FILE *pFVar7;
  long lVar8;
  Btor2Parser *pBVar9;
  Btor2Line ***pppBVar10;
  char *pcVar11;
  Btor2Line *l_00;
  Btor2Parser *bfr_00;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  
  iVar4 = parse_sort_id_bfr(bfr,&l->sort);
  if ((iVar4 != 0) && (iVar4 = parse_args(bfr,l,2), iVar4 != 0)) {
    pcVar11 = (char *)*l->args;
    if ((long)pcVar11 < 0) {
      pcVar11 = "invalid negated first argument";
    }
    else {
      if ((pcVar11 == (char *)0x0) || (bfr->ntable <= (long)pcVar11)) {
        pBVar6 = (Btor2Line *)0x0;
      }
      else {
        pBVar6 = bfr->table[(long)pcVar11];
      }
      if (pBVar6->tag == BTOR2_TAG_state) {
        pcVar1 = (char *)l->args[1];
        pcVar12 = (char *)-(long)pcVar1;
        if (0 < (long)pcVar1) {
          pcVar12 = pcVar1;
        }
        if (pcVar12 <= pcVar11) {
          __s = btor2parser_malloc((size_t)(pcVar12 + 1));
          l_00 = (Btor2Line *)0x0;
          memset(__s,0,(size_t)(pcVar12 + 1));
          bfr_00 = (Btor2Parser *)0x8;
          __ptr = (Btor2Parser *)malloc(8);
          if (__ptr == (Btor2Parser *)0x0) {
LAB_00103789:
            parse_init_bfr_cold_2();
            iVar4 = parse_sort_id_bfr(bfr_00,&l_00->sort);
            if (iVar4 == 0) {
              return 0;
            }
            iVar4 = parse_args(bfr_00,l_00,3);
            return iVar4;
          }
          pBVar9 = (Btor2Parser *)&__ptr->table;
          __ptr->error = pcVar1;
          pppBVar10 = (Btor2Line ***)pBVar9;
          do {
            pFVar2 = pBVar9[-1].file;
            pBVar9 = (Btor2Parser *)&pBVar9[-1].file;
            pFVar7 = (FILE *)-(long)pFVar2;
            if (0 < (long)pFVar2) {
              pFVar7 = pFVar2;
            }
            if (*(char *)((long)__s + (long)pFVar7) == '\0') {
              *(undefined1 *)((long)__s + (long)pFVar7) = 1;
              pBVar3 = bfr->table[(long)pFVar7];
              if (pBVar3->tag == BTOR2_TAG_input) {
                perr_bfr(bfr,
                         "inputs are not allowed in initialization expressions, use a state instead of input %ld."
                        );
                free(__s);
                free(__ptr);
                return 0;
              }
              uVar5 = pBVar3->nargs;
              if (uVar5 != 0) {
                uVar14 = 0;
                bfr_00 = __ptr;
                do {
                  __ptr = bfr_00;
                  if (pBVar9 == (Btor2Parser *)pppBVar10) {
                    lVar13 = (long)pppBVar10 - (long)bfr_00 >> 2;
                    lVar8 = (long)pppBVar10 - (long)bfr_00;
                    if (lVar8 == 0) {
                      lVar13 = 1;
                    }
                    l_00 = (Btor2Line *)(lVar13 * 8);
                    __ptr = (Btor2Parser *)realloc(bfr_00,(size_t)l_00);
                    if (__ptr == (Btor2Parser *)0x0) {
                      parse_init_bfr_cold_1();
                      goto LAB_00103789;
                    }
                    pBVar9 = (Btor2Parser *)(lVar8 + (long)__ptr);
                    pppBVar10 = (Btor2Line ***)(&__ptr->error + lVar13);
                    uVar5 = pBVar3->nargs;
                  }
                  *(FILE **)pBVar9 = (FILE *)pBVar3->args[uVar14];
                  pBVar9 = (Btor2Parser *)((long)pBVar9 + 8);
                  uVar14 = uVar14 + 1;
                  bfr_00 = __ptr;
                } while (uVar14 < uVar5);
              }
            }
            if (pBVar9 == __ptr) {
              free(__s);
              free(__ptr);
              if (pBVar6->init != 0) {
                perr_bfr(bfr,"state %ld initialized twice",pBVar6->id);
                return 0;
              }
              pBVar6->init = l->args[1];
              return 1;
            }
          } while( true );
        }
        pcVar11 = "state id must be greater than id of second operand";
      }
      else {
        pcVar11 = "expected state as first argument";
      }
    }
    perr_bfr(bfr,pcVar11);
  }
  return 0;
}

Assistant:

static int32_t
parse_init_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  Btor2Line *state;
  if (!parse_sort_id_bfr (bfr, &l->sort)) return 0;
  if (!parse_args (bfr, l, 2)) return 0;
  if (l->args[0] < 0) return perr_bfr (bfr, "invalid negated first argument");
  state = id2line_bfr (bfr, l->args[0]);
  if (state->tag != BTOR2_TAG_state)
    return perr_bfr (bfr, "expected state as first argument");
  if (l->args[0] < labs (l->args[1]))
    return perr_bfr (bfr, "state id must be greater than id of second operand");
  if (!check_state_init (bfr, l->args[0], l->args[1])) return 0;
  if (state->init)
    return perr_bfr (bfr, "state %" PRId64 " initialized twice", state->id);
  state->init = l->args[1];
  return 1;
}